

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,long *key,string_t *value)

{
  undefined4 uVar1;
  ulong uVar2;
  char (**ppacVar3) [4];
  long lVar4;
  idx_t iVar5;
  STORAGE_TYPE *__first;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *__first_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  __cmp;
  _ValueType __value;
  undefined1 local_90 [24];
  uint32_t local_78;
  char (*local_70) [4];
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_68;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *local_60;
  long local_58;
  anon_union_16_2_67f50693_for_value local_50;
  uint32_t local_40;
  char (*local_38) [4];
  
  __first_00 = this->heap;
  uVar2 = this->size;
  lVar4 = *key;
  if (uVar2 < this->capacity) {
    __first_00[uVar2].first.value = lVar4;
    HeapEntry<duckdb::string_t>::Assign(&__first_00[uVar2].second,allocator,value);
    __first = this->heap;
    iVar5 = this->size;
    this->size = iVar5 + 1;
    local_68._M_comp = Compare;
    local_58 = *(long *)((long)(&__first[iVar5].second + -1) + 0x18);
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_50.pointer,&__first[iVar5].second);
    local_90._0_8_ = local_58;
    if ((uint)local_50._0_4_ < 0xd) {
      local_90._16_8_ = local_50.pointer.ptr;
      local_78 = 0;
      ppacVar3 = &local_70;
    }
    else {
      ppacVar3 = &local_38;
      local_78 = local_40;
      local_70 = local_38;
      local_50.pointer.prefix = *local_38;
      local_90._16_8_ = local_38;
    }
    local_90[0xc] = local_50.pointer.prefix[0];
    local_90[0xd] = local_50.pointer.prefix[1];
    local_90[0xe] = local_50.pointer.prefix[2];
    local_90[0xf] = local_50.pointer.prefix[3];
    local_90._8_4_ = local_50.pointer.length;
    *ppacVar3 = (char (*) [4])0x0;
  }
  else {
    if ((__first_00->first).value <= lVar4) {
      return;
    }
    if (1 < (long)uVar2) {
      local_60 = __first_00 + (uVar2 - 1);
      local_58 = (local_60->first).value;
      HeapEntry<duckdb::string_t>::HeapEntry
                ((HeapEntry<duckdb::string_t> *)&local_50.pointer,&__first_00[uVar2 - 1].second);
      __first_00[uVar2 - 1].first.value = (__first_00->first).value;
      HeapEntry<duckdb::string_t>::operator=(&__first_00[uVar2 - 1].second,&__first_00->second);
      local_90._0_8_ = local_58;
      if ((uint)local_50._0_4_ < 0xd) {
        local_90._16_8_ = local_50.pointer.ptr;
        local_78 = 0;
        ppacVar3 = &local_70;
        uVar1 = local_50.pointer.prefix;
      }
      else {
        ppacVar3 = &local_38;
        local_78 = local_40;
        local_70 = local_38;
        uVar1 = *local_38;
        local_90._16_8_ = local_38;
      }
      local_90[0xc] = (char)uVar1;
      local_90[0xd] = SUB41(uVar1,1);
      local_90[0xe] = SUB41(uVar1,2);
      local_90[0xf] = SUB41(uVar1,3);
      local_90._8_4_ = local_50.pointer.length;
      lVar4 = (long)local_60 - (long)__first_00;
      *ppacVar3 = (char (*) [4])0x0;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                (__first_00,0,(lVar4 >> 3) * -0x3333333333333333,
                 (pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *)local_90,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
                  )Compare);
      __first_00 = this->heap;
      uVar2 = this->size;
      lVar4 = *key;
    }
    __first_00[uVar2 - 1].first.value = lVar4;
    HeapEntry<duckdb::string_t>::Assign(&__first_00[uVar2 - 1].second,allocator,value);
    __first = this->heap;
    iVar5 = this->size;
    local_68._M_comp = Compare;
    local_58 = *(long *)((long)(&__first[iVar5 - 1].second + -1) + 0x18);
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_50.pointer,&__first[iVar5 - 1].second);
    local_90._0_8_ = local_58;
    if ((uint)local_50._0_4_ < 0xd) {
      local_90._16_8_ = local_50.pointer.ptr;
      local_78 = 0;
      ppacVar3 = &local_70;
    }
    else {
      ppacVar3 = &local_38;
      local_78 = local_40;
      local_70 = local_38;
      local_50.pointer.prefix = *local_38;
      local_90._16_8_ = local_38;
    }
    local_90[0xc] = local_50.pointer.prefix[0];
    local_90[0xd] = local_50.pointer.prefix[1];
    local_90[0xe] = local_50.pointer.prefix[2];
    local_90[0xf] = local_50.pointer.prefix[3];
    local_90._8_4_ = local_50.pointer.length;
    iVar5 = iVar5 - 1;
    *ppacVar3 = (char (*) [4])0x0;
  }
  std::
  __push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
            (__first,iVar5,0,
             (pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *)local_90,
             &local_68);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}